

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constbuffer.c
# Opt level: O3

CONSTBUFFER_HANDLE CONSTBUFFER_Create_Internal(uchar *source,size_t size)

{
  LOGGER_LOG p_Var1;
  CONSTBUFFER_HANDLE pCVar2;
  CONSTBUFFER_HANDLE __dest;
  
  if (size < 0xffffffffffffffd0) {
    pCVar2 = (CONSTBUFFER_HANDLE)calloc(1,size + 0x30);
    if (pCVar2 != (CONSTBUFFER_HANDLE)0x0) {
      pCVar2->count = 1;
      (pCVar2->alias).size = size;
      if (size == 0) {
        __dest = (CONSTBUFFER_HANDLE)0x0;
      }
      else {
        __dest = pCVar2 + 1;
        memcpy(__dest,source,size);
      }
      (pCVar2->alias).buffer = (uchar *)__dest;
      pCVar2->buffer_type = CONSTBUFFER_TYPE_COPIED;
      return pCVar2;
    }
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/constbuffer.c"
                ,"CONSTBUFFER_Create_Internal",0x28,1,"invalid size parameter");
    }
  }
  p_Var1 = xlogging_get_log_function();
  if (p_Var1 != (LOGGER_LOG)0x0) {
    (*p_Var1)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/constbuffer.c"
              ,"CONSTBUFFER_Create_Internal",0x34,1,"unable to malloc");
  }
  return (CONSTBUFFER_HANDLE)0x0;
}

Assistant:

static CONSTBUFFER_HANDLE CONSTBUFFER_Create_Internal(const unsigned char* source, size_t size)
{
    CONSTBUFFER_HANDLE result;
    /*Codes_SRS_CONSTBUFFER_02_005: [The non-NULL handle returned by CONSTBUFFER_Create shall have its ref count set to "1".]*/
    /*Codes_SRS_CONSTBUFFER_02_010: [The non-NULL handle returned by CONSTBUFFER_CreateFromBuffer shall have its ref count set to "1".]*/
    size_t malloc_size = sizeof(CONSTBUFFER_HANDLE_DATA) + size;
    if (malloc_size < size)
    {
        result = NULL;
        LogError("invalid size parameter");
        /*return as is*/
    }
    else
    {
        result = (CONSTBUFFER_HANDLE)calloc(1, malloc_size);
    }

    if (result == NULL)
    {
        /*Codes_SRS_CONSTBUFFER_02_003: [If creating the copy fails then CONSTBUFFER_Create shall return NULL.]*/
        /*Codes_SRS_CONSTBUFFER_02_008: [If copying the content fails, then CONSTBUFFER_CreateFromBuffer shall fail and return NULL.] */
        LogError("unable to malloc");
        /*return as is*/
    }
    else
    {
        INIT_REF_VAR(result->count);

        /*Codes_SRS_CONSTBUFFER_02_002: [Otherwise, CONSTBUFFER_Create shall create a copy of the memory area pointed to by source having size bytes.]*/
        result->alias.size = size;
        if (size == 0)
        {
            result->alias.buffer = NULL;
        }
        else
        {
            unsigned char* temp = (unsigned char*)(result + 1);
            /*Codes_SRS_CONSTBUFFER_02_004: [Otherwise CONSTBUFFER_Create shall return a non-NULL handle.]*/
            /*Codes_SRS_CONSTBUFFER_02_007: [Otherwise, CONSTBUFFER_CreateFromBuffer shall copy the content of buffer.]*/
            /*Codes_SRS_CONSTBUFFER_02_009: [Otherwise, CONSTBUFFER_CreateFromBuffer shall return a non-NULL handle.]*/
            (void)memcpy(temp, source, size);
            result->alias.buffer = temp;
        }

        result->buffer_type = CONSTBUFFER_TYPE_COPIED;
    }
    return result;
}